

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O3

void __thiscall
llvm::SmallPtrSetImplBase::CopyFrom(SmallPtrSetImplBase *this,SmallPtrSetImplBase *RHS)

{
  uint uVar1;
  void **__ptr;
  uint uVar2;
  
  if (RHS == this) {
    __assert_fail("&RHS != this && \"Self-copy should be handled by the caller.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                  ,0x92,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
  }
  __ptr = this->CurArray;
  if (__ptr == this->SmallArray) {
    uVar1 = RHS->CurArraySize;
    if (RHS->CurArray != RHS->SmallArray) {
      if (this->CurArraySize == uVar1) goto LAB_00182d32;
      __ptr = (void **)malloc((ulong)uVar1 << 3);
      goto LAB_00182d02;
    }
    __ptr = this->SmallArray;
    if (this->CurArraySize != uVar1) {
      __assert_fail("CurArraySize == RHS.CurArraySize && \"Cannot assign sets with different small sizes\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/SmallPtrSet.cpp"
                    ,0x96,"void llvm::SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &)");
    }
  }
  else if (RHS->CurArray == RHS->SmallArray) {
    free(__ptr);
    __ptr = this->SmallArray;
  }
  else {
    if (this->CurArraySize == RHS->CurArraySize) goto LAB_00182d32;
    __ptr = (void **)realloc(__ptr,(ulong)RHS->CurArraySize << 3);
LAB_00182d02:
    if (__ptr == (void **)0x0) {
      report_bad_alloc_error("Allocation failed",true);
    }
  }
  this->CurArray = __ptr;
LAB_00182d32:
  uVar1 = RHS->CurArraySize;
  this->CurArraySize = uVar1;
  uVar2 = RHS->NumNonEmpty;
  if (RHS->CurArray == RHS->SmallArray) {
    uVar1 = uVar2;
  }
  if (uVar1 != 0) {
    memmove(__ptr,RHS->CurArray,(ulong)uVar1 << 3);
    uVar2 = RHS->NumNonEmpty;
  }
  this->NumNonEmpty = uVar2;
  this->NumTombstones = RHS->NumTombstones;
  return;
}

Assistant:

void SmallPtrSetImplBase::CopyFrom(const SmallPtrSetImplBase &RHS) {
  assert(&RHS != this && "Self-copy should be handled by the caller.");

  if (isSmall() && RHS.isSmall())
    assert(CurArraySize == RHS.CurArraySize &&
           "Cannot assign sets with different small sizes");

  // If we're becoming small, prepare to insert into our stack space
  if (RHS.isSmall()) {
    if (!isSmall())
      free(CurArray);
    CurArray = SmallArray;
  // Otherwise, allocate new heap space (unless we were the same size)
  } else if (CurArraySize != RHS.CurArraySize) {
    if (isSmall())
      CurArray = (const void**)safe_malloc(sizeof(void*) * RHS.CurArraySize);
    else {
      const void **T = (const void**)safe_realloc(CurArray,
                                             sizeof(void*) * RHS.CurArraySize);
      CurArray = T;
    }
  }

  CopyHelper(RHS);
}